

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStatePdu.cpp
# Opt level: O1

bool __thiscall DIS::EntityStatePdu::operator==(EntityStatePdu *this,EntityStatePdu *rhs)

{
  uint uVar1;
  uchar uVar2;
  uchar uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  pointer pVVar14;
  long lVar15;
  ulong uVar16;
  
  bVar5 = EntityInformationFamilyPdu::operator==
                    (&this->super_EntityInformationFamilyPdu,&rhs->super_EntityInformationFamilyPdu)
  ;
  bVar6 = EntityID::operator==(&this->_entityID,&rhs->_entityID);
  uVar2 = this->_forceId;
  uVar3 = rhs->_forceId;
  bVar7 = EntityType::operator==(&this->_entityType,&rhs->_entityType);
  bVar8 = EntityType::operator==(&this->_alternativeEntityType,&rhs->_alternativeEntityType);
  bVar9 = Vector3Float::operator==(&this->_entityLinearVelocity,&rhs->_entityLinearVelocity);
  bVar10 = Vector3Double::operator==(&this->_entityLocation,&rhs->_entityLocation);
  bVar11 = EulerAngles::operator==(&this->_entityOrientation,&rhs->_entityOrientation);
  uVar4 = this->_entityAppearance;
  uVar1 = rhs->_entityAppearance;
  bVar12 = DeadReckoningParameters::operator==
                     (&this->_deadReckoningParameters,&rhs->_deadReckoningParameters);
  bVar13 = EntityMarking::operator==(&this->_marking,&rhs->_marking);
  bVar5 = ((this->_capabilities == rhs->_capabilities && (bVar13 && bVar12)) &&
          (uVar4 == uVar1 && (bVar11 && ((bVar10 && bVar9) && (bVar8 && bVar7))))) &&
          (uVar2 == uVar3 && (bVar6 && bVar5));
  pVVar14 = (this->_variableParameters).
            super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_variableParameters).
      super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar14) {
    lVar15 = 0;
    uVar16 = 0;
    do {
      bVar6 = VariableParameter::operator==
                        ((VariableParameter *)((long)&pVVar14->_vptr_VariableParameter + lVar15),
                         (VariableParameter *)
                         ((long)&((rhs->_variableParameters).
                                  super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_VariableParameter + lVar15));
      if (!bVar6) {
        bVar5 = false;
      }
      uVar16 = uVar16 + 1;
      pVVar14 = (this->_variableParameters).
                super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x20;
    } while (uVar16 < (ulong)((long)(this->_variableParameters).
                                    super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 5)
            );
  }
  return bVar5;
}

Assistant:

bool EntityStatePdu::operator ==(const EntityStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityInformationFamilyPdu::operator==(rhs);

     if( ! (_entityID == rhs._entityID) ) ivarsEqual = false;
     if( ! (_forceId == rhs._forceId) ) ivarsEqual = false;
     if( ! (_entityType == rhs._entityType) ) ivarsEqual = false;
     if( ! (_alternativeEntityType == rhs._alternativeEntityType) ) ivarsEqual = false;
     if( ! (_entityLinearVelocity == rhs._entityLinearVelocity) ) ivarsEqual = false;
     if( ! (_entityLocation == rhs._entityLocation) ) ivarsEqual = false;
     if( ! (_entityOrientation == rhs._entityOrientation) ) ivarsEqual = false;
     if( ! (_entityAppearance == rhs._entityAppearance) ) ivarsEqual = false;
     if( ! (_deadReckoningParameters == rhs._deadReckoningParameters) ) ivarsEqual = false;
     if( ! (_marking == rhs._marking) ) ivarsEqual = false;
     if( ! (_capabilities == rhs._capabilities) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _variableParameters.size(); idx++)
     {
        if( ! ( _variableParameters[idx] == rhs._variableParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }